

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O2

void Abc_NtkPerformIfif(Abc_Ntk_t *pNtk,Ifif_Par_t *pPars)

{
  int iVar1;
  Abc_IffMan_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_IffObj_t *pAVar3;
  char *pcVar4;
  int iVar5;
  uint fDelay1;
  long lVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (6 < (uint)pPars->pLutLib->LutMax) {
    __assert_fail("pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIfif.c"
                  ,0x107,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  if ((uint)pPars->nLutSize < 7) {
    if (6 < (uint)pPars->nDegree) {
      __assert_fail("pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIfif.c"
                    ,0x109,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
    }
    Abc_NtkToAig(pNtk);
    Abc_NtkLevel(pNtk);
    if (pPars->fVerbose != 0) {
      puts("Running mapper into LUT structures with the following parameters:");
      printf("Pin+Wire: {");
      for (lVar6 = 0; lVar6 < pPars->pLutLib->LutMax; lVar6 = lVar6 + 1) {
        printf(" %3.2f",(double)pPars->pLutDelays[lVar6]);
      }
      printf(" }  ");
      pcVar4 = "Cascade";
      if (pPars->fCascade == 0) {
        pcVar4 = "Cluster";
      }
      printf("Wire %3.2f  Degree %d  Type: %s\n",(double)pPars->DelayWire,
             (ulong)(uint)pPars->nDegree,pcVar4);
    }
    p = Abc_NtkIfifStart(pNtk,pPars);
    iVar5 = 0;
    p_00 = Abc_NtkDfs(pNtk,0);
    while( true ) {
      iVar1 = p_00->nSize;
      if (iVar1 <= iVar5) {
        if (pPars->fCascade == 0) {
          fVar8 = 1.0;
        }
        else {
          fVar8 = (float)pPars->nDegree;
        }
        if (p->pPars->fVeryVerbose != 0) {
          for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
            pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar5);
            printf("Node %3d : Lev =%3d   ",(ulong)(uint)pAVar2->Id,
                   (ulong)(*(uint *)&pAVar2->field_0x14 >> 0xc));
            for (fDelay1 = 0; (float)(int)fDelay1 <= fVar8; fDelay1 = fDelay1 + 1) {
              fVar9 = Abc_IffDelay(p,pAVar2,fDelay1);
              printf("Del%d =%4.2f  ",(double)fVar9,(ulong)fDelay1);
            }
            putchar(10);
            iVar1 = p_00->nSize;
          }
        }
        free(p_00->pArray);
        free(p_00);
        fVar9 = 0.0;
        for (iVar5 = 0; iVar1 = pNtk->vCos->nSize, iVar5 < iVar1; iVar5 = iVar5 + 1) {
          pAVar2 = Abc_NtkCo(pNtk,iVar5);
          fVar10 = Abc_IffDelay(p,(Abc_Obj_t *)
                                  pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],(int)fVar8)
          ;
          if (fVar9 <= fVar10) {
            fVar9 = fVar10;
          }
        }
        iVar7 = 0;
        for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
          pAVar2 = Abc_NtkCo(pNtk,iVar5);
          fVar10 = Abc_IffDelay(p,(Abc_Obj_t *)
                                  pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],(int)fVar8)
          ;
          iVar7 = (iVar7 + 1) - (uint)(fVar10 < (float)((double)fVar9 * 0.9));
          iVar1 = pNtk->vCos->nSize;
        }
        printf("Critical delay %5.2f. Critical outputs %5.2f %%\n",(double)fVar9,
               ((double)iVar7 * 100.0) / (double)iVar1);
        Abc_NtkIfifStop(p);
        return;
      }
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar5);
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 7) break;
      pAVar3 = Abc_IffObj(p,pAVar2->Id);
      if (pPars->fCascade == 0) {
        fVar8 = Abc_ObjDelay0(p,pAVar2);
        pAVar3->Delay[0] = fVar8;
        fVar8 = Abc_ObjDelay1(p,pAVar2);
        pAVar3->Delay[1] = fVar8;
      }
      else {
        for (lVar6 = 0; lVar6 <= pPars->nDegree; lVar6 = lVar6 + 1) {
          fVar8 = Abc_ObjDelayDegree(p,pAVar2,(int)lVar6);
          pAVar3->Delay[lVar6] = fVar8;
        }
      }
      iVar5 = iVar5 + 1;
    }
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIfif.c"
                  ,0x122,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
  }
  __assert_fail("pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIfif.c"
                ,0x108,"void Abc_NtkPerformIfif(Abc_Ntk_t *, Ifif_Par_t *)");
}

Assistant:

void Abc_NtkPerformIfif( Abc_Ntk_t * pNtk, Ifif_Par_t * pPars )
{
    Abc_IffMan_t * p;
    Abc_IffObj_t * pIffObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    float Delay, Delay10, DegreeFinal;
    int i, d, Count10;
    assert( pPars->pLutLib->LutMax >= 0 && pPars->pLutLib->LutMax <= IFIF_MAX_LEAVES );
    assert( pPars->nLutSize >= 0 && pPars->nLutSize <= IFIF_MAX_LEAVES );
    assert( pPars->nDegree >= 0 && pPars->nDegree <= IFIF_MAX_LEAVES );
    // convert to AIGs
    Abc_NtkToAig( pNtk );
    Abc_NtkLevel( pNtk );

    // print parameters
    if ( pPars->fVerbose )
    {
        printf( "Running mapper into LUT structures with the following parameters:\n" );
        printf( "Pin+Wire: {" );
        for ( i = 0; i < pPars->pLutLib->LutMax; i++ )
            printf( " %3.2f", pPars->pLutDelays[i] );
        printf( " }  " );    
        printf( "Wire %3.2f  Degree %d  Type: %s\n", 
            pPars->DelayWire, pPars->nDegree, pPars->fCascade? "Cascade" : "Cluster" );
    }

    // start manager
    p = Abc_NtkIfifStart( pNtk, pPars );
//    printf( "Running experiment with LUT delay %d and degree %d (LUT size is %d).\n", DelayWire, nDegree, nLutSize );

    // compute the delay
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        assert( Abc_ObjIsNode(pObj) );
        pIffObj = Abc_IffObj( p, Abc_ObjId(pObj) );

        if ( pPars->fCascade )
        {
            for ( d = 0; d <= pPars->nDegree; d++ )
                pIffObj->Delay[d] = Abc_ObjDelayDegree( p, pObj, d );
        }
        else
        {
            pIffObj->Delay[0] = Abc_ObjDelay0( p, pObj );
            pIffObj->Delay[1] = Abc_ObjDelay1( p, pObj );
        }
    }

    // get final degree number
    if ( pPars->fCascade )
        DegreeFinal = pPars->nDegree;
    else
        DegreeFinal = 1;

    if ( p->pPars->fVeryVerbose )
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        printf( "Node %3d : Lev =%3d   ",  Abc_ObjId(pObj), Abc_ObjLevel(pObj) );
        for ( d = 0; d <= DegreeFinal; d++ )
            printf( "Del%d =%4.2f  ", d, Abc_IffDelay(p, pObj, d) );
        printf( "\n" );
    }
    Vec_PtrFree( vNodes );


    // consider delay at the outputs
    Delay = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        Delay = Abc_MaxFloat( Delay, Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) );
    Delay10 = 0.9 * Delay;

    // consider delay at the outputs
    Count10 = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
        if ( Abc_IffDelay(p, Abc_ObjFanin0(pObj), DegreeFinal) >= Delay10 )
            Count10++;

    printf( "Critical delay %5.2f. Critical outputs %5.2f %%\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );
//    printf( "%.2f %.2f\n", Delay, 100.0 * Count10 / Abc_NtkCoNum(pNtk) );

    // derive a new network

    // stop manager
    Abc_NtkIfifStop( p );
}